

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O0

int Sto_ManAddClause(Sto_Man_t *p,lit *pBeg,lit *pEnd)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Sto_Cls_t *__s;
  int local_5c;
  int *piStack_48;
  int nSize;
  lit *j;
  lit *i;
  lit Lit;
  Sto_Cls_t *pClause;
  lit *pEnd_local;
  lit *pBeg_local;
  Sto_Man_t *p_local;
  
  if (pBeg < pEnd) {
    for (j = pBeg + 1; j < pEnd; j = j + 1) {
      iVar2 = *j;
      piStack_48 = j;
      while( true ) {
        bVar1 = false;
        if (pBeg < piStack_48) {
          bVar1 = iVar2 < piStack_48[-1];
        }
        if (!bVar1) break;
        *piStack_48 = piStack_48[-1];
        piStack_48 = piStack_48 + -1;
      }
      *piStack_48 = iVar2;
    }
    for (j = pBeg + 1; j < pEnd; j = j + 1) {
      iVar2 = lit_var(j[-1]);
      iVar3 = lit_var(*j);
      if (iVar2 == iVar3) {
        printf("The clause contains two literals of the same variable: %d and %d.\n",
               (ulong)(uint)j[-1],(ulong)(uint)*j);
        return 0;
      }
    }
    iVar2 = p->nVars;
    iVar3 = lit_var(pEnd[-1]);
    if (iVar3 + 1 < iVar2) {
      local_5c = p->nVars;
    }
    else {
      local_5c = lit_var(pEnd[-1]);
      local_5c = local_5c + 1;
    }
    p->nVars = local_5c;
  }
  uVar4 = (int)(((long)pEnd - (long)pBeg >> 2) << 2) + 0x20;
  __s = (Sto_Cls_t *)
        Sto_ManMemoryFetch(p,((int)((ulong)(long)(int)uVar4 >> 3) + (uint)((uVar4 & 7) != 0)) * 8);
  memset(__s,0,0x20);
  iVar2 = p->nClauses;
  p->nClauses = iVar2 + 1;
  __s->Id = iVar2;
  *(uint *)&__s->field_0x1c =
       *(uint *)&__s->field_0x1c & 0xf8000007 |
       ((uint)((long)pEnd - (long)pBeg >> 2) & 0xffffff) << 3;
  memcpy(__s + 1,pBeg,((long)pEnd - (long)pBeg >> 2) << 2);
  if (p->pHead == (Sto_Cls_t *)0x0) {
    p->pHead = __s;
  }
  if (p->pTail == (Sto_Cls_t *)0x0) {
    p->pTail = __s;
  }
  else {
    p->pTail->pNext = __s;
    p->pTail = __s;
  }
  if ((*(uint *)&__s->field_0x1c >> 3 & 0xffffff) == 0) {
    if (p->pEmpty != (Sto_Cls_t *)0x0) {
      printf("More than one empty clause!\n");
      return 0;
    }
    p->pEmpty = __s;
  }
  return 1;
}

Assistant:

int Sto_ManAddClause( Sto_Man_t * p, lit * pBeg, lit * pEnd )
{
    Sto_Cls_t * pClause;
    lit Lit, * i, * j;
    int nSize;

    // process the literals
    if ( pBeg < pEnd )
    {
        // insertion sort
        for ( i = pBeg + 1; i < pEnd; i++ )
        {
            Lit = *i;
            for ( j = i; j > pBeg && *(j-1) > Lit; j-- )
                *j = *(j-1);
            *j = Lit;
        }
        // make sure there is no duplicated variables
        for ( i = pBeg + 1; i < pEnd; i++ )
            if ( lit_var(*(i-1)) == lit_var(*i) )
            {
                printf( "The clause contains two literals of the same variable: %d and %d.\n", *(i-1), *i );
                return 0;
            }
        // check the largest var size
        p->nVars = STO_MAX( p->nVars, lit_var(*(pEnd-1)) + 1 );
    }

    // get memory for the clause
    nSize = sizeof(Sto_Cls_t) + sizeof(lit) * (pEnd - pBeg);
    nSize = (nSize / sizeof(char*) + ((nSize % sizeof(char*)) > 0)) * sizeof(char*); // added by Saurabh on Sep 3, 2009
    pClause = (Sto_Cls_t *)Sto_ManMemoryFetch( p, nSize );
    memset( pClause, 0, sizeof(Sto_Cls_t) );

    // assign the clause
    pClause->Id = p->nClauses++;
    pClause->nLits = pEnd - pBeg;
    memcpy( pClause->pLits, pBeg, sizeof(lit) * (pEnd - pBeg) );
//    assert( pClause->pLits[0] >= 0 );

    // add the clause to the list
    if ( p->pHead == NULL )
        p->pHead = pClause;
    if ( p->pTail == NULL )
        p->pTail = pClause;
    else
    {
        p->pTail->pNext = pClause;
        p->pTail = pClause;
    }

    // add the empty clause
    if ( pClause->nLits == 0 )
    {
        if ( p->pEmpty )
        {
            printf( "More than one empty clause!\n" );
            return 0;
        }
        p->pEmpty = pClause;
    }
    return 1;
}